

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

ByteData160 * __thiscall
cfd::core::HashUtil::Output160(ByteData160 *__return_storage_ptr__,HashUtil *this)

{
  undefined8 uVar1;
  string *in_stack_ffffffffffffff60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr___00;
  CfdError error_code;
  ByteData160 *pBVar2;
  CfdException *this_00;
  allocator local_79;
  string local_78 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  HashUtil *local_18;
  HashUtil *this_local;
  
  pBVar2 = __return_storage_ptr__;
  local_18 = this;
  this_local = (HashUtil *)__return_storage_ptr__;
  if (this->hash_type_ == '\x01') {
    __return_storage_ptr___00 = &local_30;
    ByteData::GetBytes(__return_storage_ptr___00,&this->buffer_);
    Ripemd160(__return_storage_ptr__,__return_storage_ptr___00);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(__return_storage_ptr___00)
    ;
  }
  else {
    if (this->hash_type_ != '\x02') {
      this_00 = (CfdException *)__return_storage_ptr__;
      uVar1 = __cxa_allocate_exception(0x30);
      error_code = (CfdError)((ulong)__return_storage_ptr__ >> 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_78,"unknown hash type.",&local_79);
      CfdException::CfdException(this_00,error_code,in_stack_ffffffffffffff60);
      __cxa_throw(uVar1,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ByteData::GetBytes(&local_58,&this->buffer_);
    Hash160(__return_storage_ptr__,&local_58);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff60);
  }
  return pBVar2;
}

Assistant:

ByteData160 HashUtil::Output160() {
  switch (hash_type_) {
    case kRipemd160:
      return Ripemd160(buffer_.GetBytes());
    case kHash160:
      return Hash160(buffer_.GetBytes());
    case kSha256:
      // fall-through
    case kSha256D:
      // fall-through
    case kSha512:
      // fall-through
    default:
      throw CfdException(kCfdInternalError, "unknown hash type.");
  }
}